

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::w_seq<std::vector<xray_re::lw_face,std::allocator<xray_re::lw_face>>,write_face>
          (xr_writer *this,undefined8 *container)

{
  lw_face *plVar1;
  lw_face *face;
  write_face local_21;
  
  plVar1 = (lw_face *)container[1];
  for (face = (lw_face *)*container; face != plVar1; face = face + 1) {
    write_face::operator()(&local_21,face,this);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}